

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O1

pcp_errno build_pcp_options(pcp_flow_t *flow,void *cur)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ushort uVar4;
  pcp_errno pVar5;
  int iVar6;
  char *in_RAX;
  pcp_flow_priority_option_t *flowp_op;
  uint32_t i;
  uint32_t uVar7;
  size_t len_md;
  ulong __n;
  uint uVar8;
  uint8_t *__src;
  
  if (flow->flowp_option_present != '\0') {
    *(undefined1 *)cur = 99;
    *(undefined2 *)((long)cur + 2) = 0x400;
    *(uint8_t *)((long)cur + 4) = flow->flowp_dscp_up;
    in_RAX = (char *)CONCAT71((int7)((ulong)in_RAX >> 8),flow->flowp_dscp_down);
    *(uint8_t *)((long)cur + 5) = flow->flowp_dscp_down;
    cur = (void *)((long)cur + 8);
  }
  if (flow->filter_option_present != '\0') {
    *(undefined4 *)cur = 0x14000003;
    *(undefined1 *)((long)cur + 4) = 0;
    *(uint8_t *)((long)cur + 5) = flow->filter_prefix;
    in_RAX = (char *)(ulong)flow->filter_port;
    *(uint16_t *)((long)cur + 6) = flow->filter_port;
    uVar1 = *(undefined8 *)((long)&(flow->filter_ip).__in6_u + 8);
    *(undefined8 *)((long)cur + 8) = *(undefined8 *)&(flow->filter_ip).__in6_u;
    *(undefined8 *)((long)cur + 0x10) = uVar1;
    cur = (void *)((long)cur + 0x18);
  }
  if (flow->pfailure_option_present != '\0') {
    *(undefined4 *)cur = 2;
    cur = (void *)((long)cur + 4);
  }
  if (flow->third_party_option_present != '\0') {
    *(undefined2 *)cur = 1;
    uVar1 = *(undefined8 *)((long)&(flow->third_party_ip).__in6_u + 8);
    *(undefined8 *)((long)cur + 4) = *(undefined8 *)&(flow->third_party_ip).__in6_u;
    *(undefined8 *)((long)cur + 0xc) = uVar1;
    *(undefined2 *)((long)cur + 2) = 0x1000;
    cur = (void *)((long)cur + 0x14);
  }
  if ((flow->f_deviceid).deviceid[0] != '\0') {
    in_RAX = (flow->f_deviceid).deviceid;
    *(undefined1 *)cur = 0x60;
    *(undefined2 *)((long)cur + 2) = 0x2000;
    uVar1 = *(undefined8 *)((flow->f_deviceid).deviceid + 8);
    uVar2 = *(undefined8 *)((flow->f_deviceid).deviceid + 0x10);
    uVar3 = *(undefined8 *)((flow->f_deviceid).deviceid + 0x18);
    *(undefined8 *)((long)cur + 4) = *(undefined8 *)in_RAX;
    *(undefined8 *)((long)cur + 0xc) = uVar1;
    *(undefined8 *)((long)cur + 0x14) = uVar2;
    *(undefined8 *)((long)cur + 0x1c) = uVar3;
    cur = (void *)((long)cur + 0x24);
  }
  if ((flow->f_userid).userid[0] != '\0') {
    *(undefined1 *)cur = 0x62;
    *(undefined2 *)((long)cur + 2) = 2;
    in_RAX = (char *)memcpy((undefined4 *)((long)cur + 4),(flow->f_userid).userid,0x200);
    cur = (void *)((long)cur + 0x204);
  }
  if ((flow->f_location).location[0] != '\0') {
    in_RAX = (flow->f_location).location;
    *(undefined1 *)cur = 0x61;
    *(undefined2 *)((long)cur + 2) = 0x2000;
    uVar1 = *(undefined8 *)((flow->f_location).location + 8);
    uVar2 = *(undefined8 *)((flow->f_location).location + 0x10);
    uVar3 = *(undefined8 *)((flow->f_location).location + 0x18);
    *(undefined8 *)((long)cur + 4) = *(undefined8 *)in_RAX;
    *(undefined8 *)((long)cur + 0xc) = uVar1;
    *(undefined8 *)((long)cur + 0x14) = uVar2;
    *(undefined8 *)((long)cur + 0x1c) = uVar3;
    cur = (void *)((long)cur + 0x24);
  }
  pVar5 = (pcp_errno)in_RAX;
  uVar7 = flow->md_val_count;
  if ((uVar7 != 0) && (flow->md_vals != (md_val_t *)0x0)) {
    __src = flow->md_vals->val_buf;
    do {
      uVar4 = *(ushort *)(__src + -2);
      __n = (ulong)uVar4;
      if (__n != 0) {
        uVar8 = -(uint)uVar4 & 3;
        in_RAX = (char *)((long)cur + ((uVar8 + __n) - (long)flow->pcp_msg_buffer) + 8);
        if (in_RAX < (char *)0x44d) {
          *(undefined1 *)cur = 100;
          *(uint *)((long)cur + 4) =
               (((md_val_t *)(__src + -4))->md_id & 0xff00) << 8 |
               (uint)((md_val_t *)(__src + -4))->md_id << 0x18;
          memcpy((undefined4 *)((long)cur + 8),__src,__n);
          iVar6 = uVar4 + uVar8 + 4;
          uVar4 = (ushort)iVar6;
          uVar4 = uVar4 << 8 | uVar4 >> 8;
          in_RAX = (char *)(ulong)CONCAT22((short)((uint)iVar6 >> 0x10),uVar4);
          *(ushort *)((long)cur + 2) = uVar4;
          cur = (void *)((long)cur + (ulong)uVar8 + __n + 8);
        }
      }
      pVar5 = (pcp_errno)in_RAX;
      __src = __src + 0x1c;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  flow->pcp_msg_len = (int)cur - *(int *)&flow->pcp_msg_buffer;
  return pVar5;
}

Assistant:

static pcp_errno build_pcp_options(pcp_flow_t *flow, void *cur) {
#ifdef PCP_FLOW_PRIORITY
    if (flow->flowp_option_present) {
        cur = add_flowp_option(flow, cur);
    }
#endif
    if (flow->filter_option_present) {
        cur = add_filter_option(flow, cur);
    }

    if (flow->pfailure_option_present) {
        cur = add_prefer_failure_option(cur);
    }
    if (flow->third_party_option_present) {
        cur = add_third_party_option(flow, cur);
    }
#ifdef PCP_EXPERIMENTAL
    if (flow->f_deviceid.deviceid[0] != '\0') {
        cur = add_deviceid_option(flow, cur);
    }

    if (flow->f_userid.userid[0] != '\0') {
        cur = add_userid_option(flow, cur);
    }

    if (flow->f_location.location[0] != '\0') {
        cur = add_location_option(flow, cur);
    }

    if (flow->md_val_count > 0) {
        cur = add_md_options(flow, cur);
    }
#endif

    flow->pcp_msg_len = ((char *)cur) - flow->pcp_msg_buffer;

    // TODO: implement building all pcp options into msg
    return PCP_ERR_SUCCESS;
}